

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcnn.cpp
# Opt level: O2

MatrixXd * __thiscall
CppCNN::build_labels_matrix(MatrixXd *__return_storage_ptr__,CppCNN *this,VectorXd *train_labels)

{
  double dVar1;
  ostream *poVar2;
  ulong uVar3;
  Scalar *pSVar4;
  int i;
  long col;
  Scalar local_40;
  ConstantReturnType local_38;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"build_labels_matrix");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_40 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Constant
            (&local_38,this->__output_size,
             (train_labels->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
             m_storage.m_rows,&local_40);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_38);
  for (col = 0; col < (train_labels->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                      .m_storage.m_rows; col = col + 1) {
    dVar1 = (train_labels->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
            .m_data[col];
    uVar3 = (ulong)dVar1;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        __return_storage_ptr__,
                        (long)(dVar1 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3,col);
    *pSVar4 = 1.0;
  }
  return __return_storage_ptr__;
}

Assistant:

MatrixXd CppCNN::build_labels_matrix(const Eigen::VectorXd& train_labels) {
	cout << __FUNCTION__ << endl;

	MatrixXd labels_mat = MatrixXd::Constant(__output_size, train_labels.rows(), 0);
	for (int i = 0; i < train_labels.rows(); i++)
		labels_mat(static_cast<size_t>(train_labels.coeff(i)), i) = 1;

	return labels_mat;
}